

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmpp.c
# Opt level: O0

int poll(pollfd *__fds,nfds_t __nfds,int __timeout)

{
  int iVar1;
  MPP_RET ret;
  MppPollType timeout_local;
  MppPortType type_local;
  Kmpp *ctx_local;
  
  iVar1._0_2_ = __fds[4].events;
  iVar1._2_2_ = __fds[4].revents;
  if (iVar1 == 0) {
    ctx_local._4_4_ = -0x3ea;
  }
  else {
    ctx_local._4_4_ = -1;
  }
  return ctx_local._4_4_;
}

Assistant:

static MPP_RET poll(Kmpp *ctx, MppPortType type, MppPollType timeout)
{
    MPP_RET ret = MPP_NOK;
    (void)type;
    (void)timeout;

    if (!ctx->mInitDone)
        return MPP_ERR_INIT;

    return ret;
}